

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  *this;
  _Base_ptr p_Var2;
  pointer pcVar3;
  VolumeFile *this_00;
  options_description_easy_init *poVar4;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar5;
  options_description *poVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  any *paVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  size_t sVar13;
  long lVar14;
  int iVar15;
  char *pcVar16;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  *this_01;
  bool bVar17;
  bool bVar18;
  array<VolumeFile_*,_3UL> volumes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  restParams;
  variables_map restVarMap;
  basic_parsed_options<char> parsedOpts;
  options_description decryptOpts;
  options_description generalOpts;
  Salsa20Cipher cipher;
  options_description allOpts;
  options_description unpackOpts;
  variables_map varMap;
  uint8_t key [32];
  VolumeFile *local_cd0 [3];
  undefined1 local_cb8 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_ca8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c08;
  undefined1 local_bf0 [16];
  undefined1 local_be0 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_bb0;
  options_description *local_b80 [78];
  _Alloc_hider local_910;
  size_type local_908;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_900;
  basic_parsed_options<char> local_8f0;
  options_description local_8c8;
  options_description local_848;
  undefined1 local_7c8 [16];
  undefined1 auStack_7b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_7a8;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  fStack_798;
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_778;
  options_description *local_758;
  _Alloc_hider local_4e8;
  size_type local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  options_description local_4c8;
  options_description local_448;
  variables_map local_3c8;
  undefined1 local_328 [16];
  undefined1 auStack_318 [720];
  pointer local_48;
  pointer pVStack_40;
  pointer local_38;
  
  local_bf0._0_8_ = (options_description *)local_be0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bf0,"General options","");
  boost::program_options::options_description::options_description
            (&local_848,(string *)local_bf0,0x50,0x28);
  if ((options_description *)local_bf0._0_8_ != (options_description *)local_be0) {
    operator_delete((void *)local_bf0._0_8_,(ulong)(local_be0._0_8_ + 1));
  }
  local_bf0._0_8_ = boost::program_options::options_description::add_options(&local_848);
  poVar4 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)local_bf0,"help,h","Display help message");
  poVar4 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar4,"unpack,u","Unpack volume files");
  boost::program_options::options_description_easy_init::operator()
            (poVar4,"decrypt,d","Decrypt file");
  local_bf0._0_8_ = (options_description *)local_be0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bf0,"Unpack options","");
  boost::program_options::options_description::options_description
            (&local_448,(string *)local_bf0,0x50,0x28);
  if ((options_description *)local_bf0._0_8_ != (options_description *)local_be0) {
    operator_delete((void *)local_bf0._0_8_,(ulong)(local_be0._0_8_ + 1));
  }
  local_bf0._0_8_ = boost::program_options::options_description::add_options(&local_448);
  ptVar5 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  poVar4 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)local_bf0,"input,i",(value_semantic *)ptVar5,
                      "Volume/Index file");
  ptVar5 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  boost::program_options::options_description_easy_init::operator()
            (poVar4,"output,o",(value_semantic *)ptVar5,"Output directory");
  local_bf0._0_8_ = (options_description *)local_be0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bf0,"Decrypt options","");
  boost::program_options::options_description::options_description
            (&local_8c8,(string *)local_bf0,0x50,0x28);
  if ((options_description *)local_bf0._0_8_ != (options_description *)local_be0) {
    operator_delete((void *)local_bf0._0_8_,(ulong)(local_be0._0_8_ + 1));
  }
  local_bf0._0_8_ = boost::program_options::options_description::add_options(&local_8c8);
  ptVar5 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  poVar4 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)local_bf0,"input,i",(value_semantic *)ptVar5,
                      "Input file");
  ptVar5 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  poVar4 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar4,"output,o",(value_semantic *)ptVar5,"Output file");
  ptVar5 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  boost::program_options::options_description_easy_init::operator()
            (poVar4,"key,k",(value_semantic *)ptVar5,"Encryption key");
  boost::program_options::options_description::options_description(&local_4c8,0x50,0x28);
  poVar6 = (options_description *)
           boost::program_options::options_description::add(&local_4c8,&local_848);
  poVar6 = (options_description *)
           boost::program_options::options_description::add(poVar6,&local_448);
  boost::program_options::options_description::add(poVar6,&local_8c8);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_bf0,argc,argv);
  boost::program_options::detail::cmdline::style((cmdline *)local_bf0,0x3f7);
  boost::program_options::detail::cmdline::allow_unregistered((cmdline *)local_bf0);
  boost::program_options::detail::cmdline::set_options_description((cmdline *)local_bf0,&local_848);
  local_b80[0] = &local_848;
  boost::program_options::basic_command_line_parser<char>::run
            (&local_8f0,(basic_command_line_parser<char> *)local_bf0);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1((function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                *)&local_bb0._M_impl.super__Rb_tree_header._M_header._M_parent);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)(local_be0 + 0x20));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_bf0);
  boost::program_options::variables_map::variables_map(&local_3c8);
  boost::program_options::store((basic_parsed_options *)&local_8f0,&local_3c8,false);
  boost::program_options::collect_unrecognized<char>
            (&local_c08,&local_8f0.options,include_positional);
  boost::program_options::notify(&local_3c8);
  local_bf0._0_8_ = (options_description *)local_be0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bf0,"help","");
  this = &local_3c8.
          super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ;
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(&this->_M_t,(key_type *)local_bf0);
  if ((options_description *)local_bf0._0_8_ != (options_description *)local_be0) {
    operator_delete((void *)local_bf0._0_8_,(ulong)(local_be0._0_8_ + 1));
  }
  if ((_Rb_tree_header *)cVar7._M_node ==
      &local_3c8.
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
       ._M_t._M_impl.super__Rb_tree_header) {
    local_bf0._0_8_ = (options_description *)local_be0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_bf0,"decrypt","");
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(&this->_M_t,(key_type *)local_bf0);
    if ((options_description *)local_bf0._0_8_ != (options_description *)local_be0) {
      operator_delete((void *)local_bf0._0_8_,(ulong)(local_be0._0_8_ + 1));
    }
    if (cVar8._M_node == cVar7._M_node) {
      local_bf0._0_8_ = (options_description *)local_be0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_bf0,"unpack","");
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::find(&this->_M_t,(key_type *)local_bf0);
      if ((options_description *)local_bf0._0_8_ != (options_description *)local_be0) {
        operator_delete((void *)local_bf0._0_8_,(ulong)(local_be0._0_8_ + 1));
      }
      if (cVar8._M_node == cVar7._M_node) goto LAB_00119125;
      boost::program_options::variables_map::variables_map((variables_map *)local_cb8);
      boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
                ((basic_command_line_parser<char> *)local_bf0,&local_c08);
      boost::program_options::detail::cmdline::style((cmdline *)local_bf0,0x3f7);
      boost::program_options::detail::cmdline::allow_unregistered((cmdline *)local_bf0);
      boost::program_options::detail::cmdline::set_options_description
                ((cmdline *)local_bf0,&local_8c8);
      local_b80[0] = &local_8c8;
      boost::program_options::basic_command_line_parser<char>::run
                ((basic_parsed_options<char> *)local_7c8,
                 (basic_command_line_parser<char> *)local_bf0);
      boost::program_options::store
                ((basic_parsed_options *)local_7c8,(variables_map *)local_cb8,false);
      std::
      vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
      ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                 *)local_7c8);
      boost::
      function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
      ::~function1((function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                    *)&local_bb0._M_impl.super__Rb_tree_header._M_header._M_parent);
      boost::
      function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)(local_be0 + 0x20));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_bf0);
      boost::program_options::notify((variables_map *)local_cb8);
      local_bf0._0_8_ = (options_description *)local_be0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_bf0,"input","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::find(&local_ca8,(key_type *)local_bf0);
      p_Var1 = &local_ca8._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)cVar7._M_node == p_Var1) {
        bVar17 = true;
      }
      else {
        local_7c8._0_8_ = (pointer)auStack_7b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"output","");
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::find(&local_ca8,(key_type *)local_7c8);
        bVar17 = (_Rb_tree_header *)cVar7._M_node == p_Var1;
        if ((pointer)local_7c8._0_8_ != (pointer)auStack_7b8) {
          operator_delete((void *)local_7c8._0_8_,(ulong)(auStack_7b8._0_8_ + 1));
        }
      }
      if ((options_description *)local_bf0._0_8_ != (options_description *)local_be0) {
        operator_delete((void *)local_bf0._0_8_,(ulong)(local_be0._0_8_ + 1));
      }
      iVar15 = 0;
      if (!bVar17) {
        local_bf0._0_8_ = (options_description *)local_be0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_bf0,"input","");
        paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]
                                  ((abstract_variables_map *)local_cb8,(string *)local_bf0);
        pbVar10 = boost::any_cast<std::__cxx11::string_const&>(paVar9);
        if ((options_description *)local_bf0._0_8_ != (options_description *)local_be0) {
          operator_delete((void *)local_bf0._0_8_,(ulong)(local_be0._0_8_ + 1));
        }
        local_bf0._0_8_ = (options_description *)local_be0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_bf0,"output","");
        paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]
                                  ((abstract_variables_map *)local_cb8,(string *)local_bf0);
        pbVar11 = boost::any_cast<std::__cxx11::string_const&>(paVar9);
        if ((options_description *)local_bf0._0_8_ != (options_description *)local_be0) {
          operator_delete((void *)local_bf0._0_8_,(ulong)(local_be0._0_8_ + 1));
        }
        pcVar3 = (pbVar10->_M_dataplus)._M_p;
        local_bf0._0_8_ = (options_description *)local_be0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_bf0,pcVar3,pcVar3 + pbVar10->_M_string_length);
        boost::filesystem::detail::status((detail *)local_7c8,(path *)local_bf0,(error_code *)0x0);
        bVar18 = true;
        if (1 < (uint)local_7c8._0_4_) {
          local_7c8._0_8_ = auStack_7b8;
          pcVar3 = (pbVar10->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_7c8,pcVar3,pcVar3 + pbVar10->_M_string_length);
          boost::filesystem::detail::status((detail *)local_328,(path *)local_7c8,(error_code *)0x0)
          ;
          bVar18 = local_328._0_4_ != 2;
          if ((pointer)local_7c8._0_8_ != (pointer)auStack_7b8) {
            operator_delete((void *)local_7c8._0_8_,(ulong)(auStack_7b8._0_8_ + 1));
          }
        }
        if ((options_description *)local_bf0._0_8_ != (options_description *)local_be0) {
          operator_delete((void *)local_bf0._0_8_,(ulong)(local_be0._0_8_ + 1));
        }
        if (bVar18) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Invalid volume file specified.",0x1e);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
          std::ostream::put(-0x50);
          iVar15 = 1;
          std::ostream::flush();
        }
        else {
          pcVar3 = (pbVar11->_M_dataplus)._M_p;
          local_bf0._0_8_ = (options_description *)local_be0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_bf0,pcVar3,pcVar3 + pbVar11->_M_string_length);
          boost::filesystem::detail::status((detail *)local_7c8,(path *)local_bf0,(error_code *)0x0)
          ;
          local_c10 = pbVar11;
          if ((uint)local_7c8._0_4_ < 2) {
            bVar18 = false;
          }
          else {
            local_7c8._0_8_ = auStack_7b8;
            pcVar3 = (pbVar11->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_7c8,pcVar3,pcVar3 + pbVar11->_M_string_length);
            boost::filesystem::detail::status
                      ((detail *)local_328,(path *)local_7c8,(error_code *)0x0);
            bVar18 = local_328._0_4_ != 3;
            if ((pointer)local_7c8._0_8_ != (pointer)auStack_7b8) {
              operator_delete((void *)local_7c8._0_8_,(ulong)(auStack_7b8._0_8_ + 1));
            }
          }
          if ((options_description *)local_bf0._0_8_ != (options_description *)local_be0) {
            operator_delete((void *)local_bf0._0_8_,(ulong)(local_be0._0_8_ + 1));
          }
          if (bVar18) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Invalid output directory specified.",0x23);
            iVar15 = 1;
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          }
          else {
            VolumeFile::VolumeFile((VolumeFile *)local_bf0,true);
            local_910._M_p = (pointer)&local_900;
            local_bf0._0_8_ = &PTR__GT5VolumeFile_0017f748;
            local_908 = 0;
            local_900._M_local_buf[0] = '\0';
            VolumeFile::VolumeFile((VolumeFile *)local_7c8,true);
            local_4e8._M_p = (pointer)&local_4d8;
            local_4e0 = 0;
            local_4d8._M_local_buf[0] = '\0';
            local_7c8._0_8_ = &PTR__GT5VolumeFile_0017f818;
            VolumeFile::VolumeFile((VolumeFile *)local_328,false);
            local_cd0[0] = (VolumeFile *)local_bf0;
            local_cd0[1] = (VolumeFile *)local_7c8;
            pcVar16 = "Unable to load volume file.";
            lVar14 = 0;
            local_cd0[2] = (VolumeFile *)local_328;
            local_328._0_8_ = &PTR__GT7VolumeFile_0017f7b0;
            local_48 = (pointer)0x0;
            pVStack_40 = (pointer)0x0;
            local_38 = (pointer)0x0;
            do {
              this_00 = *(VolumeFile **)((long)local_cd0 + lVar14);
              bVar18 = VolumeFile::load(this_00,pbVar10);
              if (bVar18) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Unpacking files...",0x12);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                bVar18 = VolumeFile::unpackAll(this_00,local_c10);
                if (bVar18) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Done!",5);
                  iVar15 = 0;
                  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                  goto LAB_001190cb;
                }
                lVar14 = 0x1d;
                pcVar16 = "Unable to unpack volume file.";
                goto LAB_001190ab;
              }
              lVar14 = lVar14 + 8;
            } while (lVar14 != 0x18);
            lVar14 = 0x1b;
LAB_001190ab:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar16,lVar14)
            ;
            iVar15 = 1;
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_001190cb:
            GT7VolumeFile::~GT7VolumeFile((GT7VolumeFile *)local_328);
            GT5VolumeFile::~GT5VolumeFile((GT5VolumeFile *)local_7c8);
            GT5VolumeFile::~GT5VolumeFile((GT5VolumeFile *)local_bf0);
          }
        }
      }
      this_01 = &local_ca8;
      local_cb8._0_8_ = &PTR__variables_map_0017e008;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_c48);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_c78);
    }
    else {
      boost::program_options::variables_map::variables_map((variables_map *)local_bf0);
      boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
                ((basic_command_line_parser<char> *)local_7c8,&local_c08);
      boost::program_options::detail::cmdline::style((cmdline *)local_7c8,0x3f7);
      boost::program_options::detail::cmdline::allow_unregistered((cmdline *)local_7c8);
      boost::program_options::detail::cmdline::set_options_description
                ((cmdline *)local_7c8,&local_8c8);
      local_758 = &local_8c8;
      boost::program_options::basic_command_line_parser<char>::run
                ((basic_parsed_options<char> *)local_328,
                 (basic_command_line_parser<char> *)local_7c8);
      boost::program_options::store
                ((basic_parsed_options *)local_328,(variables_map *)local_bf0,false);
      std::
      vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
      ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                 *)local_328);
      boost::
      function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
      ::~function1(&local_778);
      boost::
      function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~function1(&fStack_798);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_7c8);
      boost::program_options::notify((variables_map *)local_bf0);
      local_7c8._0_8_ = (pointer)auStack_7b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"input","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                      *)local_be0,(key_type *)local_7c8);
      p_Var2 = (_Base_ptr)(local_be0 + 8);
      if (cVar7._M_node == p_Var2) {
        bVar17 = true;
      }
      else {
        local_328._0_8_ = (pointer)auStack_318;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"output","");
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                        *)local_be0,(key_type *)local_328);
        if (cVar7._M_node == p_Var2) {
          bVar17 = true;
        }
        else {
          local_cb8._0_8_ = &local_ca8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_cb8,"key","");
          cVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                          *)local_be0,(key_type *)local_cb8);
          bVar17 = cVar7._M_node == p_Var2;
          if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               *)local_cb8._0_8_ != &local_ca8) {
            operator_delete((void *)local_cb8._0_8_,local_ca8._M_impl._0_8_ + 1);
          }
        }
        if ((pointer)local_328._0_8_ != (pointer)auStack_318) {
          operator_delete((void *)local_328._0_8_,(ulong)(auStack_318._0_8_ + 1));
        }
      }
      if ((pointer)local_7c8._0_8_ != (pointer)auStack_7b8) {
        operator_delete((void *)local_7c8._0_8_,(ulong)(auStack_7b8._0_8_ + 1));
      }
      iVar15 = 0;
      if (!bVar17) {
        local_7c8._0_8_ = (pointer)auStack_7b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"input","");
        paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]
                                  ((abstract_variables_map *)local_bf0,(string *)local_7c8);
        pbVar10 = boost::any_cast<std::__cxx11::string_const&>(paVar9);
        if ((pointer)local_7c8._0_8_ != (pointer)auStack_7b8) {
          operator_delete((void *)local_7c8._0_8_,(ulong)(auStack_7b8._0_8_ + 1));
        }
        local_7c8._0_8_ = (pointer)auStack_7b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"output","");
        paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]
                                  ((abstract_variables_map *)local_bf0,(string *)local_7c8);
        pbVar11 = boost::any_cast<std::__cxx11::string_const&>(paVar9);
        if ((pointer)local_7c8._0_8_ != (pointer)auStack_7b8) {
          operator_delete((void *)local_7c8._0_8_,(ulong)(auStack_7b8._0_8_ + 1));
        }
        local_7c8._0_8_ = (pointer)auStack_7b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"key","");
        paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]
                                  ((abstract_variables_map *)local_bf0,(string *)local_7c8);
        pbVar12 = boost::any_cast<std::__cxx11::string_const&>(paVar9);
        if ((pointer)local_7c8._0_8_ != (pointer)auStack_7b8) {
          operator_delete((void *)local_7c8._0_8_,(ulong)(auStack_7b8._0_8_ + 1));
        }
        local_328._0_8_ = (pointer)0x0;
        local_328._8_8_ = (pointer)0x0;
        auStack_318._0_8_ = (pointer)0x0;
        auStack_318._8_8_ = (options_description *)0x0;
        sVar13 = parseHexString((pbVar12->_M_dataplus)._M_p,local_328,0x20);
        if (sVar13 == 0x20) {
          pcVar3 = (pbVar10->_M_dataplus)._M_p;
          local_7c8._0_8_ = (pointer)auStack_7b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_7c8,pcVar3,pcVar3 + pbVar10->_M_string_length);
          boost::filesystem::detail::status((detail *)local_cb8,(path *)local_7c8,(error_code *)0x0)
          ;
          bVar18 = true;
          if (1 < (uint)local_cb8._0_4_) {
            local_cb8._0_8_ = &local_ca8;
            pcVar3 = (pbVar10->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_cb8,pcVar3,pcVar3 + pbVar10->_M_string_length);
            boost::filesystem::detail::status
                      ((detail *)local_cd0,(path *)local_cb8,(error_code *)0x0);
            bVar18 = (int)local_cd0[0] != 2;
            if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                 *)local_cb8._0_8_ != &local_ca8) {
              operator_delete((void *)local_cb8._0_8_,local_ca8._M_impl._0_8_ + 1);
            }
          }
          if ((pointer)local_7c8._0_8_ != (pointer)auStack_7b8) {
            operator_delete((void *)local_7c8._0_8_,(ulong)(auStack_7b8._0_8_ + 1));
          }
          if (!bVar18) {
            pcVar3 = (pbVar11->_M_dataplus)._M_p;
            local_7c8._0_8_ = (pointer)auStack_7b8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_7c8,pcVar3,pcVar3 + pbVar11->_M_string_length);
            boost::filesystem::detail::status
                      ((detail *)local_cb8,(path *)local_7c8,(error_code *)0x0);
            if ((uint)local_cb8._0_4_ < 2) {
              bVar18 = false;
            }
            else {
              local_cb8._0_8_ = &local_ca8;
              pcVar3 = (pbVar11->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_cb8,pcVar3,pcVar3 + pbVar11->_M_string_length);
              boost::filesystem::detail::status
                        ((detail *)local_cd0,(path *)local_cb8,(error_code *)0x0);
              bVar18 = (int)local_cd0[0] != 2;
              if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)local_cb8._0_8_ != &local_ca8) {
                operator_delete((void *)local_cb8._0_8_,local_ca8._M_impl._0_8_ + 1);
              }
            }
            if ((pointer)local_7c8._0_8_ != (pointer)auStack_7b8) {
              operator_delete((void *)local_7c8._0_8_,(ulong)(auStack_7b8._0_8_ + 1));
            }
            if (bVar18) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Invalid output file specified.",0x1e);
              iVar15 = 1;
              std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            }
            else {
              local_cb8._0_8_ =
                   (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    *)0x0;
              local_cb8._8_8_ = (abstract_variables_map *)0x0;
              local_ca8._M_impl._0_8_ = 0;
              bVar18 = loadFromFile(pbVar10,(vector<unsigned_char,_std::allocator<unsigned_char>_> *
                                            )local_cb8);
              if (bVar18) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Decrypting file...",0x12);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                local_7c8._0_8_ = (pointer)0x0;
                local_7c8._8_8_ = (pointer)0x0;
                auStack_7b8._0_8_ = (pointer)0x0;
                auStack_7b8._8_8_ = 0;
                aStack_7a8._M_allocated_capacity = 0;
                aStack_7a8._8_8_ = (positional_options_description *)0x0;
                fStack_798.super_function_base.vtable = (vtable_base *)0x0;
                fStack_798.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
                Salsa20Cipher::setKey((Salsa20Cipher *)local_7c8,local_328,0x20);
                auStack_7b8._8_8_ = 0;
                aStack_7a8._M_allocated_capacity = 0;
                Salsa20Cipher::processBytes
                          ((Salsa20Cipher *)local_7c8,(uint8_t *)local_cb8._0_8_,
                           (uint8_t *)local_cb8._0_8_,local_cb8._8_8_ - local_cb8._0_8_);
                bVar18 = saveToFile(pbVar11,(void *)local_cb8._0_8_,
                                    local_cb8._8_8_ - local_cb8._0_8_);
                if (bVar18) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Done!",5);
                  iVar15 = 0;
                  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Unable to load input file.",0x1a);
                  iVar15 = 1;
                  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Unable to load input file.",0x1a);
                iVar15 = 1;
                std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
              }
              if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)local_cb8._0_8_ !=
                  (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)0x0) {
                operator_delete((void *)local_cb8._0_8_,local_ca8._M_impl._0_8_ - local_cb8._0_8_);
              }
            }
            goto LAB_001189af;
          }
          lVar14 = 0x1d;
          pcVar16 = "Invalid input file specified.";
        }
        else {
          lVar14 = 0x16;
          pcVar16 = "Invalid key specified.";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar16,lVar14);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
        std::ostream::put(-0x50);
        iVar15 = 1;
        std::ostream::flush();
      }
LAB_001189af:
      local_bf0._0_8_ = &PTR__variables_map_0017e008;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_b80);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_bb0);
      this_01 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                 *)local_be0;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
    ::~_Rb_tree(this_01);
    if (!bVar17) goto LAB_00119181;
  }
LAB_00119125:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"GT Tool (c) flatz, 2018",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  iVar15 = 0;
  boost::program_options::operator<<((ostream *)&std::cout,&local_4c8);
LAB_00119181:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c08);
  local_3c8.super_abstract_variables_map._vptr_abstract_variables_map =
       (_func_int **)&PTR__variables_map_0017e008;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_3c8.m_required._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_3c8.m_final._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(&this->_M_t);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&local_8f0.options);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(&local_4c8.groups);
  if (local_4c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_4c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_4c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_4c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_4c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_4c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_4c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_4c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_4c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(&local_4c8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.m_caption._M_dataplus._M_p != &local_4c8.m_caption.field_2) {
    operator_delete(local_4c8.m_caption._M_dataplus._M_p,
                    local_4c8.m_caption.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(&local_8c8.groups);
  if (local_8c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_8c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_8c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_8c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_8c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_8c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_8c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_8c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_8c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(&local_8c8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c8.m_caption._M_dataplus._M_p != &local_8c8.m_caption.field_2) {
    operator_delete(local_8c8.m_caption._M_dataplus._M_p,
                    local_8c8.m_caption.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(&local_448.groups);
  if (local_448.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_448.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_448.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_448.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_448.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_448.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_448.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_448.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_448.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(&local_448.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448.m_caption._M_dataplus._M_p != &local_448.m_caption.field_2) {
    operator_delete(local_448.m_caption._M_dataplus._M_p,
                    local_448.m_caption.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(&local_848.groups);
  if (local_848.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_848.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_848.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_848.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_848.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_848.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_848.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_848.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_848.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(&local_848.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848.m_caption._M_dataplus._M_p != &local_848.m_caption.field_2) {
    operator_delete(local_848.m_caption._M_dataplus._M_p,
                    local_848.m_caption.field_2._M_allocated_capacity + 1);
  }
  return iVar15;
}

Assistant:

int main(int argc, const char* argv[])
{
	try {
		boost::program_options::options_description generalOpts("General options");
		generalOpts.add_options()
			("help,h", "Display help message")
			("unpack,u", "Unpack volume files")
			("decrypt,d", "Decrypt file")
		;

		boost::program_options::options_description unpackOpts("Unpack options");
		unpackOpts.add_options()
			("input,i", boost::program_options::value<std::string>(), "Volume/Index file")
			("output,o", boost::program_options::value<std::string>(), "Output directory")
		;

		boost::program_options::options_description decryptOpts("Decrypt options");
		decryptOpts.add_options()
			("input,i", boost::program_options::value<std::string>(), "Input file")
			("output,o", boost::program_options::value<std::string>(), "Output file")
			("key,k", boost::program_options::value<std::string>(), "Encryption key")
		;

		boost::program_options::options_description allOpts;
		allOpts.add(generalOpts).add(unpackOpts).add(decryptOpts);

		auto parsedOpts = boost::program_options::command_line_parser(argc, argv)
			.style(boost::program_options::command_line_style::unix_style)
			.allow_unregistered()
			.options(generalOpts)
			.run();

		boost::program_options::variables_map varMap;
		boost::program_options::store(parsedOpts, varMap);
		const auto restParams = boost::program_options::collect_unrecognized(parsedOpts.options, boost::program_options::include_positional);
		boost::program_options::notify(varMap);

		if (varMap.count("help")) {
show_help:
			std::cout << "GT Tool (c) flatz, 2018" << std::endl;
			std::cout << allOpts;
		} else if (varMap.count("decrypt")) {
			boost::program_options::variables_map restVarMap;
			boost::program_options::store(
				boost::program_options::command_line_parser(restParams)
					.style(boost::program_options::command_line_style::unix_style)
					.allow_unregistered()
					.options(decryptOpts)
					.run(),
				restVarMap
			);
			boost::program_options::notify(restVarMap);

			if (!restVarMap.count("input") || !restVarMap.count("output") || !restVarMap.count("key")) {
				goto show_help;
			}

			const auto& inFile = restVarMap["input"].as<std::string>();
			const auto& outFile = restVarMap["output"].as<std::string>();
			const auto& keyStr = restVarMap["key"].as<std::string>();

			uint8_t key[0x20] = {};
			if (parseHexString(keyStr, key, sizeof(key)) != sizeof(key)) {
				std::cerr << "Invalid key specified." << std::endl;
				return EXIT_FAILURE;
			}

			if (!boost::filesystem::exists(inFile) || !boost::filesystem::is_regular_file(inFile)) {
				std::cerr << "Invalid input file specified." << std::endl;
				return EXIT_FAILURE;
			}
			if (boost::filesystem::exists(outFile) && !boost::filesystem::is_regular_file(outFile)) {
				std::cerr << "Invalid output file specified." << std::endl;
				return EXIT_FAILURE;
			}

			std::vector<uint8_t> data;
			if (!loadFromFile(inFile, data)) {
				std::cerr << "Unable to load input file." << std::endl;
				return EXIT_FAILURE;
			}

			std::cout << "Decrypting file..." << std::endl;

			Salsa20Cipher cipher(key, sizeof(key));
			cipher.processBytes(data.data(), data.data(), data.size());

			if (!saveToFile(outFile, data.data(), data.size())) {
				std::cerr << "Unable to load input file." << std::endl;
				return EXIT_FAILURE;
			}

			std::cout << "Done!" << std::endl;
			return EXIT_SUCCESS;
		} else if (varMap.count("unpack")) {
			boost::program_options::variables_map restVarMap;
			boost::program_options::store(
				boost::program_options::command_line_parser(restParams)
					.style(boost::program_options::command_line_style::unix_style)
					.allow_unregistered()
					.options(decryptOpts)
					.run(),
				restVarMap
			);
			boost::program_options::notify(restVarMap);

			if (!restVarMap.count("input") || !restVarMap.count("output")) {
				goto show_help;
			}

			const auto& inFile = restVarMap["input"].as<std::string>();
			const auto& outDir = restVarMap["output"].as<std::string>();

			if (!boost::filesystem::exists(inFile) || !boost::filesystem::is_regular_file(inFile)) {
				std::cerr << "Invalid volume file specified." << std::endl;
				return EXIT_FAILURE;
			}
			if (boost::filesystem::exists(outDir) && !boost::filesystem::is_directory(outDir)) {
				std::cerr << "Invalid output directory specified." << std::endl;
				return EXIT_FAILURE;
			}

			GT5VolumeFile vol5;
			GT6VolumeFile vol6;
			GT7VolumeFile vol7;
			std::array<VolumeFile*, 3> volumes = {{ &vol5, &vol6, &vol7 }};
			VolumeFile* volume = nullptr;
			for (auto vol: volumes) {
				if (vol->load(inFile)) {
					volume = vol;
					break;
				}
			}
			if (!volume) {
				std::cerr << "Unable to load volume file." << std::endl;
				return EXIT_FAILURE;
			}

			std::cout << "Unpacking files..." << std::endl;
			if (!volume->unpackAll(outDir)) {
				std::cerr << "Unable to unpack volume file." << std::endl;
				return EXIT_FAILURE;
			}

			std::cout << "Done!" << std::endl;
			return EXIT_SUCCESS;
		} else {
			goto show_help;
		}
	}
	catch (const std::exception& e) {
		std::cerr << "Unhandled error occurred:" << std::endl << e.what() << std::endl;
		return EXIT_FAILURE;
	}

	return 0;
}